

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall propset_token_source::insert_token(propset_token_source *this,CTcToken *tok)

{
  CTcToken *t;
  propset_tok *in_RDI;
  propset_tok *cur;
  CTcPrsMem *in_stack_ffffffffffffffd8;
  
  t = (CTcToken *)operator_new((size_t)in_RDI,in_stack_ffffffffffffffd8);
  propset_tok::propset_tok(in_RDI,t);
  if (in_RDI[1].tok.text_len_ == 0) {
    in_RDI[1].tok.text_ = (char *)t;
  }
  else {
    *(CTcToken **)(in_RDI[1].tok.text_len_ + 0x28) = t;
  }
  in_RDI[1].tok.text_len_ = (size_t)t;
  return;
}

Assistant:

void propset_token_source::insert_token(const CTcToken *tok)
{
	/* create a new link entry and initialize it */
    propset_tok *cur = new (G_prsmem) propset_tok(tok);

	/* link it into our list */
    if (last_tok != 0)
        last_tok->nxt = cur;
    else
        nxt_tok = cur;
    last_tok = cur;
}